

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.cpp
# Opt level: O2

void __thiscall Threading::SpinLock::Wait(SpinLock *this)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0x40;
  do {
    bVar2 = lVar1 == 0;
    lVar1 = lVar1 + -1;
    if (bVar2) {
      sched_yield();
      return;
    }
  } while (((this->m_IsLocked)._M_base._M_i & 1U) != 0);
  return;
}

Assistant:

void SpinLock::Wait() noexcept
{
    // Wait for the lock to be released without generating cache misses.
    constexpr size_t NumAttemptsToYield = 64;
    for (size_t Attempt = 0; Attempt < NumAttemptsToYield; ++Attempt)
    {
        if (!is_locked())
            return;

        // Issue X86 PAUSE or ARM YIELD instruction to reduce contention
        // between hyper-threads.
        PAUSE();
    }

    std::this_thread::yield();
}